

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O2

fft_real_object fft_real_init(int N,int sgn)

{
  int N_00;
  fft_real_object pfVar1;
  fft_object pfVar2;
  ulong uVar3;
  fft_real_object pfVar4;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double *pdVar5;
  
  N_00 = (int)((long)N / 2);
  pfVar1 = (fft_real_object)malloc((long)N_00 * 0x10 + 0x18);
  pfVar2 = fft_init(N_00,sgn);
  uVar6 = 0;
  uVar3 = (long)N / 2 & 0xffffffff;
  if (N_00 < 1) {
    uVar3 = uVar6;
  }
  pfVar1->cobj = pfVar2;
  pfVar4 = pfVar1;
  for (; pdVar5 = &pfVar4->twiddle2[0].im, uVar3 != uVar6; uVar6 = uVar6 + 1) {
    dVar7 = ((double)(int)uVar6 * 6.283185307179586) / (double)N;
    dVar8 = cos(dVar7);
    pfVar4->twiddle2[0].re = dVar8;
    dVar7 = sin(dVar7);
    *pdVar5 = dVar7;
    pfVar4 = (fft_real_object)pdVar5;
  }
  return pfVar1;
}

Assistant:

fft_real_object fft_real_init(int N, int sgn) {
	fft_real_object obj = NULL;
	fft_type PI, theta;
	int k;
	
	PI = 3.1415926535897932384626433832795;
	
	obj = (fft_real_object) malloc (sizeof(struct fft_real_set) + sizeof(fft_data)* (N/2));
	
	obj->cobj = fft_init(N/2,sgn);
	
	for (k = 0; k < N/2;++k) {
		theta = PI2*k/N;
		obj->twiddle2[k].re = cos(theta);
		obj->twiddle2[k].im = sin(theta);
		
	}


	return obj;
	
	
}